

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O0

int VP8BitWriterAppend(VP8BitWriter *bw,uint8_t *data,size_t size)

{
  size_t in_RDX;
  void *in_RSI;
  size_t in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (*(int *)(in_RDI + 0xc) == -8) {
    iVar1 = BitWriterResize((VP8BitWriter *)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      memcpy((void *)(*(long *)(in_RDI + 0x10) + *(long *)(in_RDI + 0x18)),in_RSI,in_RDX);
      *(size_t *)(in_RDI + 0x18) = in_RDX + *(long *)(in_RDI + 0x18);
      iVar1 = 1;
    }
  }
  else {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int VP8BitWriterAppend(VP8BitWriter* const bw,
                       const uint8_t* data, size_t size) {
  assert(data != NULL);
  if (bw->nb_bits_ != -8) return 0;   // Flush() must have been called
  if (!BitWriterResize(bw, size)) return 0;
  memcpy(bw->buf_ + bw->pos_, data, size);
  bw->pos_ += size;
  return 1;
}